

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

bool el::base::utils::OS::termSupportsColor(void)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  char *in_stack_00000008;
  char *in_stack_00000010;
  char *in_stack_00000018;
  string term;
  char *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc1;
  undefined1 in_stack_ffffffffffffffc2;
  undefined1 in_stack_ffffffffffffffc3;
  undefined1 in_stack_ffffffffffffffc4;
  undefined1 in_stack_ffffffffffffffc5;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  byte bVar6;
  string local_20 [32];
  
  getEnvironmentVariable_abi_cxx11_(in_stack_00000018,in_stack_00000010,in_stack_00000008);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffffc7,
                                   CONCAT16(in_stack_ffffffffffffffc6,
                                            CONCAT15(in_stack_ffffffffffffffc5,
                                                     CONCAT14(in_stack_ffffffffffffffc4,
                                                              CONCAT13(in_stack_ffffffffffffffc3,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffffc2,
                                                  CONCAT11(in_stack_ffffffffffffffc1,
                                                           in_stack_ffffffffffffffc0))))))),
                          in_stack_ffffffffffffffb8);
  bVar6 = true;
  if (!bVar1) {
    uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(1,CONCAT16(in_stack_ffffffffffffffc6,
                                                CONCAT15(in_stack_ffffffffffffffc5,
                                                         CONCAT14(in_stack_ffffffffffffffc4,
                                                                  CONCAT13(in_stack_ffffffffffffffc3
                                                                           ,CONCAT12(
                                                  in_stack_ffffffffffffffc2,
                                                  CONCAT11(in_stack_ffffffffffffffc1,
                                                           in_stack_ffffffffffffffc0))))))),
                            in_stack_ffffffffffffffb8);
    bVar6 = true;
    if (!(bool)uVar2) {
      uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(1,CONCAT16(uVar2,CONCAT15(in_stack_ffffffffffffffc5,
                                                                 CONCAT14(in_stack_ffffffffffffffc4,
                                                                          CONCAT13(
                                                  in_stack_ffffffffffffffc3,
                                                  CONCAT12(in_stack_ffffffffffffffc2,
                                                           CONCAT11(in_stack_ffffffffffffffc1,
                                                                    in_stack_ffffffffffffffc0)))))))
                              ,in_stack_ffffffffffffffb8);
      bVar6 = true;
      if (!(bool)uVar3) {
        uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(
                                                  in_stack_ffffffffffffffc4,
                                                  CONCAT13(in_stack_ffffffffffffffc3,
                                                           CONCAT12(in_stack_ffffffffffffffc2,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffc1,
                                                  in_stack_ffffffffffffffc0))))))),
                                in_stack_ffffffffffffffb8);
        bVar6 = true;
        if (!(bool)uVar4) {
          uVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,
                                                  CONCAT13(in_stack_ffffffffffffffc3,
                                                           CONCAT12(in_stack_ffffffffffffffc2,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffc1,
                                                  in_stack_ffffffffffffffc0))))))),
                                  in_stack_ffffffffffffffb8);
          bVar6 = true;
          if (!(bool)uVar5) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_ffffffffffffffc2,
                                                                          CONCAT11(
                                                  in_stack_ffffffffffffffc1,
                                                  in_stack_ffffffffffffffc0))))))),
                                    in_stack_ffffffffffffffb8);
            bVar6 = true;
            if (!bVar1) {
              bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,
                                                  CONCAT13(uVar5,CONCAT12(bVar1,CONCAT11(
                                                  in_stack_ffffffffffffffc1,
                                                  in_stack_ffffffffffffffc0))))))),
                                      in_stack_ffffffffffffffb8);
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string(local_20);
  return (bool)(bVar6 & 1);
}

Assistant:

static inline bool termSupportsColor(void) {
    std::string term = getEnvironmentVariable("TERM", "");
    return term == "xterm" || term == "xterm-color" || term == "xterm-256color"
           || term == "screen" || term == "linux" || term == "cygwin"
           || term == "screen-256color";
  }